

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

HDRImageBuffer * load_exr(char *file_path)

{
  float fVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  pointer pVVar5;
  undefined1 auVar6 [16];
  int iVar7;
  ostream *poVar8;
  HDRImageBuffer *this;
  int i;
  long lVar9;
  ulong uVar10;
  char *err;
  EXRImage exr;
  
  exr.num_custom_attributes = 0;
  exr.num_channels = 0;
  exr.channel_names = (char **)0x0;
  exr.images = (uchar **)0x0;
  exr.pixel_types = (int *)0x0;
  exr.requested_pixel_types = (int *)0x0;
  iVar7 = ParseMultiChannelEXRHeaderFromFile(&exr,file_path,&err);
  if (iVar7 == 0) {
    for (lVar9 = 0; lVar9 < exr.num_channels; lVar9 = lVar9 + 1) {
      if (exr.pixel_types[lVar9] == 1) {
        exr.requested_pixel_types[lVar9] = 2;
      }
    }
    iVar7 = LoadMultiChannelEXRFromFile(&exr,file_path,&err);
    if (iVar7 != 0) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"[PathTracer] ");
      poVar8 = std::operator<<(poVar8,"Error loading OpenEXR file: ");
      poVar8 = std::operator<<(poVar8,err);
      std::endl<char,std::char_traits<char>>(poVar8);
      exit(1);
    }
    this = (HDRImageBuffer *)operator_new(0x28);
    (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->w = 0;
    this->h = 0;
    (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    CGL::HDRImageBuffer::resize(this,(long)exr.width,(long)exr.height);
    puVar2 = exr.images[2];
    puVar3 = *exr.images;
    puVar4 = exr.images[1];
    lVar9 = 0x10;
    for (uVar10 = 0; uVar10 < (ulong)((long)exr.height * (long)exr.width); uVar10 = uVar10 + 1) {
      fVar1 = *(float *)(puVar3 + uVar10 * 4);
      pVVar5 = (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      auVar6 = vinsertps_avx(ZEXT416(*(uint *)(puVar2 + uVar10 * 4)),
                             ZEXT416(*(uint *)(puVar4 + uVar10 * 4)),0x10);
      auVar6 = vcvtps2pd_avx(auVar6);
      *(undefined1 (*) [16])((long)pVVar5 + lVar9 + -0x10) = auVar6;
      *(double *)((long)&pVVar5->field_0 + lVar9) = (double)fVar1;
      lVar9 = lVar9 + 0x20;
    }
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cerr,"[PathTracer] ");
    poVar8 = std::operator<<(poVar8,"Error parsing OpenEXR file: ");
    poVar8 = std::operator<<(poVar8,err);
    std::endl<char,std::char_traits<char>>(poVar8);
    this = (HDRImageBuffer *)0x0;
  }
  return this;
}

Assistant:

HDRImageBuffer* load_exr(const char* file_path) {
  
  const char* err;
  
  EXRImage exr;
  InitEXRImage(&exr);

  int ret = ParseMultiChannelEXRHeaderFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error parsing OpenEXR file: " << err);
    return NULL;
  }

  for (int i = 0; i < exr.num_channels; i++) {
    if (exr.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  ret = LoadMultiChannelEXRFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error loading OpenEXR file: " << err);
    exit(EXIT_FAILURE);
  }

  HDRImageBuffer* envmap = new HDRImageBuffer();
  envmap->resize(exr.width, exr.height);
  float* channel_r = (float*) exr.images[2];
  float* channel_g = (float*) exr.images[1];
  float* channel_b = (float*) exr.images[0];
  for (size_t i = 0; i < exr.width * exr.height; i++) {
    envmap->data[i] = Vector3D(channel_r[i], 
                               channel_g[i], 
                               channel_b[i]);
  }

  return envmap;
}